

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O1

void __thiscall
fasttext::Autotune::train(Autotune *this,Args *autotuneArgs,AutotuneCallback *callback)

{
  int iVar1;
  int iVar2;
  AutotuneStrategy *__ptr;
  double dVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  AutotuneStrategy *this_00;
  long *plVar7;
  _Any_data *this_01;
  ostream *poVar8;
  Autotune *pAVar9;
  invalid_argument *this_02;
  runtime_error *this_03;
  char *pcVar10;
  pointer __p;
  ElapsedTimeMarker elapsedTimeMarker;
  Meter meter;
  Args bestTrainArgs;
  Args trainArgs;
  ifstream validationFileStream;
  double local_748;
  metric_name local_734;
  time_point local_730;
  string local_728;
  _Any_data local_708;
  __node_base local_6f8;
  void *pvStack_6f0;
  undefined8 local_6e8;
  long lStack_6e0;
  undefined8 local_6d8;
  _Hashtable<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  _Stack_6d0;
  undefined1 local_698;
  Args local_568;
  Args local_3d0;
  istream local_238 [120];
  Autotune local_1c0 [4];
  
  std::ifstream::ifstream(local_238,(string *)&autotuneArgs->autotuneValidationFile,_S_in);
  pAVar9 = local_1c0;
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 == '\0') {
    this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_02,"Validation file cannot be opened!");
    __cxa_throw(this_02,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  printSkippedArgs(pAVar9,autotuneArgs);
  std::function<void_(double,_int,_double,_double)>::operator=(&this->callback_,callback);
  this->verbose_ = autotuneArgs->autotuneVerbose;
  iVar1 = autotuneArgs->verbose;
  Args::Args(&local_568,autotuneArgs);
  Args::Args(&local_3d0,autotuneArgs);
  local_3d0.verbose = 0;
  this_00 = (AutotuneStrategy *)operator_new(0x1d8);
  AutotuneStrategy::AutotuneStrategy(this_00,&local_3d0,(long)autotuneArgs->seed);
  local_708._M_unused._M_object = (AutotuneStrategy *)0x0;
  __ptr = (this->strategy_)._M_t.
          super___uniq_ptr_impl<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
          ._M_t.
          super__Tuple_impl<0UL,_fasttext::AutotuneStrategy_*,_std::default_delete<fasttext::AutotuneStrategy>_>
          .super__Head_base<0UL,_fasttext::AutotuneStrategy_*,_false>._M_head_impl;
  (this->strategy_)._M_t.
  super___uniq_ptr_impl<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
  ._M_t.
  super__Tuple_impl<0UL,_fasttext::AutotuneStrategy_*,_std::default_delete<fasttext::AutotuneStrategy>_>
  .super__Head_base<0UL,_fasttext::AutotuneStrategy_*,_false>._M_head_impl = this_00;
  if (__ptr != (AutotuneStrategy *)0x0) {
    std::default_delete<fasttext::AutotuneStrategy>::operator()
              ((default_delete<fasttext::AutotuneStrategy> *)&this->strategy_,__ptr);
  }
  if ((AutotuneStrategy *)local_708._M_unused._0_8_ != (AutotuneStrategy *)0x0) {
    std::default_delete<fasttext::AutotuneStrategy>::operator()
              ((default_delete<fasttext::AutotuneStrategy> *)local_708._M_pod_data,
               (AutotuneStrategy *)local_708._M_unused._0_8_);
  }
  startTimer(this,autotuneArgs);
  bVar4 = false;
  while ((((this->continueTraining_)._M_base._M_i & 1U) != 0 &&
         (this->elapsed_ < (double)autotuneArgs->autotuneDuration))) {
    this->trials_ = this->trials_ + 1;
    AutotuneStrategy::ask
              ((Args *)&local_708,
               (this->strategy_)._M_t.
               super___uniq_ptr_impl<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
               ._M_t.
               super__Tuple_impl<0UL,_fasttext::AutotuneStrategy_*,_std::default_delete<fasttext::AutotuneStrategy>_>
               .super__Head_base<0UL,_fasttext::AutotuneStrategy_*,_false>._M_head_impl,
               this->elapsed_);
    Args::operator=(&local_3d0,(Args *)&local_708);
    this_01 = &local_708;
    Args::~Args((Args *)&local_708);
    if (2 < autotuneArgs->verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Trial = ",8);
      plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->trials_);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      this_01 = (_Any_data *)std::ostream::put((char)plVar7);
      std::ostream::flush();
    }
    printArgs((Autotune *)this_01,&local_3d0,autotuneArgs);
    local_730.__d.__r = (duration)0;
    local_730.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_6f8._M_nxt = (_Hash_node_base *)0x0;
    pvStack_6f0 = (void *)0x0;
    local_708._M_unused._M_object = (AutotuneStrategy *)0x0;
    local_708._8_8_ = 0;
    FastText::train(this->fastText_,&local_3d0,(TrainCallback *)&local_708);
    if (local_6f8._M_nxt != (_Hash_node_base *)0x0) {
      (*(code *)local_6f8._M_nxt)(&local_708,&local_708,3);
    }
    bVar6 = quantize(this,&local_3d0,autotuneArgs);
    if (bVar6) {
      Args::getAutotuneMetricLabel_abi_cxx11_(&local_728,autotuneArgs);
      local_698 = local_728._M_string_length != 0;
      local_6d8 = 0;
      local_708._M_unused._M_object = (AutotuneStrategy *)0x0;
      local_708._8_8_ = 0;
      local_6f8._M_nxt = (_Hash_node_base *)0x0;
      pvStack_6f0 = (void *)0x0;
      local_6e8 = 0;
      lStack_6e0 = 0;
      _Stack_6d0._M_buckets = &_Stack_6d0._M_single_bucket;
      _Stack_6d0._M_bucket_count = 1;
      _Stack_6d0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      _Stack_6d0._M_element_count = 0;
      _Stack_6d0._M_rehash_policy._M_max_load_factor = 1.0;
      _Stack_6d0._M_rehash_policy._4_4_ = 0;
      _Stack_6d0._M_rehash_policy._M_next_resize = 0;
      _Stack_6d0._M_single_bucket = (__node_base_ptr)0x0;
      FastText::test(this->fastText_,local_238,autotuneArgs->autotunePredictions,0.0,
                     (Meter *)&local_708);
      local_734 = Args::getAutotuneMetric(autotuneArgs);
      dVar3 = Args::getAutotuneMetricValue(autotuneArgs);
      local_748 = getMetricScore(this,(Meter *)&local_708,&local_734,dVar3,&local_728);
      dVar3 = this->bestScore_;
      if (((dVar3 == -1.0) && (!NAN(dVar3))) || (dVar3 < local_748)) {
        Args::operator=(&local_568,&local_3d0);
        this->bestScore_ = local_748;
        AutotuneStrategy::updateBest
                  ((this->strategy_)._M_t.
                   super___uniq_ptr_impl<fasttext::AutotuneStrategy,_std::default_delete<fasttext::AutotuneStrategy>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_fasttext::AutotuneStrategy_*,_std::default_delete<fasttext::AutotuneStrategy>_>
                   .super__Head_base<0UL,_fasttext::AutotuneStrategy_*,_false>._M_head_impl,
                   &local_568);
      }
      std::
      _Hashtable<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&_Stack_6d0);
      if (pvStack_6f0 != (void *)0x0) {
        operator_delete(pvStack_6f0,lStack_6e0 - (long)pvStack_6f0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_728._M_dataplus._M_p != &local_728.field_2) {
        operator_delete(local_728._M_dataplus._M_p,local_728.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      iVar2 = this->sizeConstraintFailed_;
      this->sizeConstraintFailed_ = iVar2 + 1;
      if (bVar4) {
        local_748 = NAN;
      }
      else {
        local_748 = NAN;
        if ((int)((uint)this->trials_ >> 1) <= iVar2 && 10 < this->trials_) {
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
          std::ostream::put(-0x18);
          poVar8 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,
                     "Warning : requested model size is probably too small. You may want to increase `autotune-modelsize`."
                     ,100);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          bVar4 = true;
          std::ostream::flush();
          local_748 = NAN;
        }
      }
    }
    if (2 < autotuneArgs->verbose) {
      if (NAN(local_748)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"currentScore = NaN",0x12);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
        poVar8 = (ostream *)&std::cout;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"currentScore = ",0xf);
        poVar8 = std::ostream::_M_insert<double>(local_748);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      }
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
    if (2 < autotuneArgs->verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"train took = ",0xd);
      local_708._M_unused._0_8_ = (undefined8)std::chrono::_V2::steady_clock::now();
      dVar3 = utils::getDuration(&local_730,(time_point *)&local_708);
      poVar8 = std::ostream::_M_insert<double>(dVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
  }
  if ((this->timer_)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->bestScore_ == -1.0) && (!NAN(this->bestScore_))) {
    local_708._M_unused._M_object = &local_6f8;
    local_708._8_8_ = 0;
    local_6f8._M_nxt = local_6f8._M_nxt & 0xffffffffffffff00;
    pcVar10 = "Didn\'t have enough time to train once: please increase `autotune-duration`.";
    if (bVar4) {
      pcVar10 = "Couldn\'t fulfil model size constraint: please increase `autotune-modelsize`.";
    }
    std::__cxx11::string::operator=((string *)local_708._M_pod_data,pcVar10);
    this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_03,(string *)local_708._M_pod_data);
    __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Training again with best arguments",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
  pAVar9 = (Autotune *)std::ostream::put(-0x18);
  std::ostream::flush();
  local_568.verbose = iVar1;
  if (2 < autotuneArgs->verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Best selected args = ",0x15);
    plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    pAVar9 = (Autotune *)std::ostream::put((char)plVar7);
    std::ostream::flush();
  }
  printArgs(pAVar9,&local_568,autotuneArgs);
  local_6f8._M_nxt = (_Hash_node_base *)0x0;
  pvStack_6f0 = (void *)0x0;
  local_708._M_unused._M_object = (void *)0x0;
  local_708._8_8_ = 0;
  FastText::train(this->fastText_,&local_568,(TrainCallback *)&local_708);
  if (local_6f8._M_nxt != (_Hash_node_base *)0x0) {
    (*(code *)local_6f8._M_nxt)(&local_708,&local_708,3);
  }
  quantize(this,&local_568,autotuneArgs);
  Args::~Args(&local_3d0);
  Args::~Args(&local_568);
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void Autotune::train(const Args& autotuneArgs, const AutotuneCallback& callback) {
  std::ifstream validationFileStream(autotuneArgs.autotuneValidationFile);
  if (!validationFileStream.is_open()) {
    throw std::invalid_argument("Validation file cannot be opened!");
  }
  printSkippedArgs(autotuneArgs);

  this->callback_ = callback;
  this->verbose_ = autotuneArgs.autotuneVerbose;

  bool sizeConstraintWarning = false;
  int verbose = autotuneArgs.verbose;
  Args bestTrainArgs(autotuneArgs);
  Args trainArgs(autotuneArgs);
  trainArgs.verbose = 0;
  strategy_ = std::unique_ptr<AutotuneStrategy>(
      new AutotuneStrategy(trainArgs, autotuneArgs.seed));
  startTimer(autotuneArgs);

  while (keepTraining(autotuneArgs.autotuneDuration)) {
    trials_++;

    trainArgs = strategy_->ask(elapsed_);
    LOG_VAL(Trial, trials_)
    printArgs(trainArgs, autotuneArgs);
    ElapsedTimeMarker elapsedTimeMarker;
    double currentScore = std::numeric_limits<double>::quiet_NaN();
    try {
      fastText_->train(trainArgs);
      bool sizeConstraintOK = quantize(trainArgs, autotuneArgs);
      if (sizeConstraintOK) {
        const auto& metricLabel = autotuneArgs.getAutotuneMetricLabel();
        Meter meter(!metricLabel.empty());
        fastText_->test(
            validationFileStream, autotuneArgs.autotunePredictions, 0.0, meter);

        currentScore = getMetricScore(
            meter,
            autotuneArgs.getAutotuneMetric(),
            autotuneArgs.getAutotuneMetricValue(),
            metricLabel);

        if (bestScore_ == kUnknownBestScore || (currentScore > bestScore_)) {
          bestTrainArgs = trainArgs;
          bestScore_ = currentScore;
          strategy_->updateBest(bestTrainArgs);
        }
      } else {
        sizeConstraintFailed_++;
        if (!sizeConstraintWarning && trials_ > 10 &&
            sizeConstraintFailed_ > (trials_ / 2)) {
          sizeConstraintWarning = true;
          std::cerr << std::endl
                    << "Warning : requested model size is probably too small. "
                       "You may want to increase `autotune-modelsize`."
                    << std::endl;
        }
      }
    } catch (DenseMatrix::EncounteredNaNError&) {
      // ignore diverging loss and go on
    } catch (std::bad_alloc&) {
      // ignore parameter samples asking too much memory
    } catch (TimeoutError&) {
      break;
    } catch (FastText::AbortError&) {
      break;
    }
    LOG_VAL_NAN(currentScore, currentScore)
    LOG_VAL(train took, elapsedTimeMarker.getElapsed())
  }
  if (timer_.joinable()) {
    timer_.join();
  }

  if (bestScore_ == kUnknownBestScore) {
    std::string errorMessage;
    if (sizeConstraintWarning) {
      errorMessage =
          "Couldn't fulfil model size constraint: please increase "
          "`autotune-modelsize`.";
    } else {
      errorMessage =
          "Didn't have enough time to train once: please increase "
          "`autotune-duration`.";
    }
    throw std::runtime_error(errorMessage);
  } else {
    std::cerr << std::endl;
    std::cerr << "Training again with best arguments" << std::endl;
    bestTrainArgs.verbose = verbose;
    LOG_VAL(Best selected args, 0)
    printArgs(bestTrainArgs, autotuneArgs);
    fastText_->train(bestTrainArgs);
    quantize(bestTrainArgs, autotuneArgs);
  }
}